

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

int byteoffset(lua_State *L)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer pos;
  long lVar4;
  bool bVar5;
  char *local_40;
  long local_38;
  lua_Integer posi;
  lua_Integer n;
  char *s;
  size_t len;
  lua_State *L_local;
  
  len = (size_t)L;
  pcVar3 = luaL_checklstring(L,1,(size_t *)&s);
  posi = luaL_checkinteger((lua_State *)len,2);
  if (posi < 0) {
    local_40 = s + 1;
  }
  else {
    local_40 = (char *)0x1;
  }
  pos = luaL_optinteger((lua_State *)len,3,(lua_Integer)local_40);
  local_38 = u_posrelat(pos,(size_t)s);
  bVar5 = false;
  if (0 < local_38) {
    local_38 = local_38 + -1;
    bVar5 = local_38 <= (long)s;
  }
  if (!bVar5) {
    luaL_argerror((lua_State *)len,3,"position out of bounds");
  }
  if (posi == 0) {
    while( true ) {
      bVar5 = false;
      if (0 < local_38) {
        bVar5 = ((int)pcVar3[local_38] & 0xc0U) == 0x80;
      }
      if (!bVar5) break;
      local_38 = local_38 + -1;
    }
  }
  else {
    if (((int)pcVar3[local_38] & 0xc0U) == 0x80) {
      iVar2 = luaL_error((lua_State *)len,"initial position is a continuation byte");
      return iVar2;
    }
    if (posi < 0) {
      for (; posi < 0 && 0 < local_38; posi = posi + 1) {
        do {
          local_38 = local_38 + -1;
          bVar5 = false;
          if (0 < local_38) {
            bVar5 = ((int)pcVar3[local_38] & 0xc0U) == 0x80;
          }
        } while (bVar5);
      }
    }
    else {
      while (posi = posi + -1, 0 < posi && local_38 < (long)s) {
        do {
          local_38 = local_38 + 1;
        } while (((int)pcVar3[local_38] & 0xc0U) == 0x80);
      }
    }
  }
  if (posi == 0) {
    lua_pushinteger((lua_State *)len,local_38 + 1);
    if (((int)pcVar3[local_38] & 0x80U) != 0) {
      do {
        lVar4 = local_38 + 1;
        lVar1 = local_38 + 2;
        local_38 = lVar4;
      } while (((int)pcVar3[lVar1] & 0xc0U) == 0x80);
    }
    lua_pushinteger((lua_State *)len,local_38 + 1);
    L_local._4_4_ = 2;
  }
  else {
    lua_pushnil((lua_State *)len);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int byteoffset (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer n  = luaL_checkinteger(L, 2);
  lua_Integer posi = (n >= 0) ? 1 : cast_st2S(len) + 1;
  posi = u_posrelat(luaL_optinteger(L, 3, posi), len);
  luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer)len, 3,
                   "position out of bounds");
  if (n == 0) {
    /* find beginning of current byte sequence */
    while (posi > 0 && iscontp(s + posi)) posi--;
  }
  else {
    if (iscontp(s + posi))
      return luaL_error(L, "initial position is a continuation byte");
    if (n < 0) {
      while (n < 0 && posi > 0) {  /* move back */
        do {  /* find beginning of previous character */
          posi--;
        } while (posi > 0 && iscontp(s + posi));
        n++;
      }
    }
    else {
      n--;  /* do not move for 1st character */
      while (n > 0 && posi < (lua_Integer)len) {
        do {  /* find beginning of next character */
          posi++;
        } while (iscontp(s + posi));  /* (cannot pass final '\0') */
        n--;
      }
    }
  }
  if (n != 0) {  /* did not find given character? */
    luaL_pushfail(L);
    return 1;
  }
  lua_pushinteger(L, posi + 1);  /* initial position */
  if ((s[posi] & 0x80) != 0) {  /* multi-byte character? */
    do {
      posi++;
    } while (iscontp(s + posi + 1));  /* skip to final byte */
  }
  /* else one-byte character: final position is the initial one */
  lua_pushinteger(L, posi + 1);  /* 'posi' now is the final position */
  return 2;
}